

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SharedContext::removeConstraint(SharedContext *this,uint32 idx,bool detach)

{
  Constraint *pCVar1;
  size_type sVar2;
  size_type sVar3;
  uint32 uVar4;
  Solver *pSVar5;
  reference ppCVar6;
  reference ppSVar7;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  Solver *x;
  size_type s;
  Constraint *c;
  ConstraintDB *db;
  iterator in_stack_ffffffffffffff98;
  ConstraintDB *this_00;
  size_type local_24;
  
  pSVar5 = master((SharedContext *)0x1d6e24);
  this_00 = &pSVar5->constraints_;
  sVar2 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                    (this_00);
  if (sVar2 <= in_ESI) {
    Potassco::fail(-2,"void Clasp::SharedContext::removeConstraint(uint32, bool)",0x485,
                   "idx < db.size()",(char *)0x0);
  }
  ppCVar6 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
            operator[](this_00,in_ESI);
  pCVar1 = *ppCVar6;
  local_24 = 1;
  while( true ) {
    sVar3 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::size
                      ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)
                       (in_RDI + 0xe8));
    if (local_24 == sVar3) break;
    ppSVar7 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::operator[]
                        ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)
                         (in_RDI + 0xe8),local_24);
    pSVar5 = *ppSVar7;
    pSVar5->dbIdx_ = pSVar5->dbIdx_ - (uint)(in_ESI < pSVar5->dbIdx_);
    local_24 = local_24 + 1;
  }
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin(this_00);
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
            (this_00,in_stack_ffffffffffffff98);
  uVar4 = sizeVec<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
                    ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                     0x1d6f3a);
  pSVar5 = master((SharedContext *)0x1d6f48);
  pSVar5->dbIdx_ = uVar4;
  pSVar5 = master((SharedContext *)0x1d6f66);
  (*pCVar1->_vptr_Constraint[5])(pCVar1,pSVar5,in_DL & 1);
  return;
}

Assistant:

void SharedContext::removeConstraint(uint32 idx, bool detach) {
	Solver::ConstraintDB& db = master()->constraints_;
	POTASSCO_REQUIRE(idx < db.size());
	Constraint* c = db[idx];
	for (SolverVec::size_type s = 1; s != solvers_.size(); ++s) {
		Solver& x = *solvers_[s];
		x.dbIdx_ -= (idx < x.dbIdx_);
	}
	db.erase(db.begin()+idx);
	master()->dbIdx_ = sizeVec(db);
	c->destroy(master(), detach);
}